

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O2

void DequeueConsoleText(void)

{
  TextQueue *pTVar1;
  char *text;
  TextQueue *pTVar2;
  
  pTVar2 = EnqueuedText;
  while (pTVar2 != (TextQueue *)0x0) {
    pTVar1 = pTVar2->Next;
    text = (pTVar2->Text).Chars;
    if (pTVar2->bNotify == true) {
      C_AddNotifyString(pTVar2->PrintLevel,text);
    }
    else {
      AddToConsole(pTVar2->PrintLevel,text);
    }
    FString::~FString(&pTVar2->Text);
    operator_delete(pTVar2,0x18);
    pTVar2 = pTVar1;
  }
  EnqueuedText = (TextQueue *)0x0;
  EnqueuedTextTail = &EnqueuedText;
  return;
}

Assistant:

void DequeueConsoleText ()
{
	TextQueue *queued = EnqueuedText;

	while (queued != NULL)
	{
		TextQueue *next = queued->Next;
		if (queued->bNotify)
		{
			C_AddNotifyString (queued->PrintLevel, queued->Text);
		}
		else
		{
			AddToConsole (queued->PrintLevel, queued->Text);
		}
		delete queued;
		queued = next;
	}
	EnqueuedText = NULL;
	EnqueuedTextTail = &EnqueuedText;
}